

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

bool __thiscall
miniros::MasterLink::getParamImpl<std::__cxx11::string>
          (MasterLink *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec,bool cached)

{
  bool bVar1;
  int iVar2;
  XmlRpcValue *pXVar3;
  RpcValue *xml_value;
  long lVar4;
  long lVar5;
  RpcValue xml_array;
  RpcValue local_70;
  XmlRpcValue local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._type = TypeInvalid;
  local_70._value.asDouble = 0.0;
  bVar1 = getParamImpl(this,key,&local_70,cached);
  if (bVar1 && local_70._type == TypeArray) {
    iVar2 = XmlRpc::XmlRpcValue::size(&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(vec,(long)iVar2);
    lVar4 = 0;
    lVar5 = 0;
    while( true ) {
      iVar2 = XmlRpc::XmlRpcValue::size(&local_70);
      bVar1 = iVar2 <= lVar5;
      if (iVar2 <= lVar5) break;
      pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_70,(int)lVar5);
      if (pXVar3->_type != TypeString) break;
      pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_70,(int)lVar5);
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_60,pXVar3);
      xml_cast<std::__cxx11::string>(&local_50,(miniros *)&local_60,xml_value);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((vec->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4),
                 (string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      XmlRpc::XmlRpcValue::~XmlRpcValue(&local_60);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x20;
    }
  }
  else {
    bVar1 = false;
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_70);
  return bVar1;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::vector<T>& vec, bool cached)
{
  RpcValue xml_array;
  if (!getParamImpl(key, xml_array, cached)) {
    return false;
  }

  // Make sure it's an array type
  if (xml_array.getType() != RpcValue::TypeArray) {
    return false;
  }

  // Resize the target vector (destructive)
  vec.resize(xml_array.size());

  // Fill the vector with stuff
  for (int i = 0; i < xml_array.size(); i++) {
    if (!xml_castable<T>(xml_array[i].getType())) {
      return false;
    }

    vec[i] = xml_cast<T>(xml_array[i]);
  }

  return true;
}